

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t init_traditional_PKWARE_decryption(archive_read *a)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  wchar_t wVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  byte c;
  size_t sVar8;
  uint i;
  long lVar9;
  uint uVar10;
  byte abStack_3c [12];
  
  pvVar1 = a->format->data;
  wVar4 = L'\0';
  if (*(char *)((long)pvVar1 + 0x1f84) == '\0') {
    if (((*(byte *)(*(long *)((long)pvVar1 + 0x70) + 0x7e) & 8) == 0) &&
       (*(long *)((long)pvVar1 + 0x78) < 0xc)) {
      archive_set_error(&a->archive,0x54,"Truncated Zip encrypted body: only %jd bytes available");
    }
    else {
      pvVar5 = __archive_read_ahead(a,0xc,(ssize_t *)0x0);
      if (pvVar5 != (void *)0x0) {
        uVar10 = 0;
        do {
          pcVar6 = __archive_read_next_passphrase(a);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "Incorrect passphrase";
            if (uVar10 == 0) {
              pcVar6 = "Passphrase required for this entry";
            }
LAB_00165996:
            archive_set_error(&a->archive,-1,pcVar6);
            iVar3 = 1;
          }
          else {
            sVar7 = strlen(pcVar6);
            *(undefined8 *)((long)pvVar1 + 0x1f78) = 0x2345678912345678;
            *(undefined4 *)((long)pvVar1 + 0x1f80) = 0x34567890;
            if (sVar7 != 0) {
              sVar8 = 0;
              do {
                trad_enc_update_keys((trad_enc_ctx *)((long)pvVar1 + 0x1f78),pcVar6[sVar8]);
                sVar8 = sVar8 + 1;
              } while (sVar7 != sVar8);
            }
            lVar9 = 0;
            do {
              uVar2 = *(uint *)((long)pvVar1 + 0x1f80) | 2;
              c = (byte)((uVar2 ^ 1) * uVar2 >> 8) ^ *(byte *)((long)pvVar5 + lVar9);
              abStack_3c[lVar9] = c;
              trad_enc_update_keys((trad_enc_ctx *)((long)pvVar1 + 0x1f78),c);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0xc);
            iVar3 = 2;
            if (abStack_3c[0xb] != *(char *)(*(long *)((long)pvVar1 + 0x70) + 0x83)) {
              iVar3 = 0;
              pcVar6 = "Too many incorrect passphrases";
              if (10000 < uVar10) goto LAB_00165996;
            }
          }
          if (iVar3 != 0) {
            if (iVar3 != 2) {
              return L'\xffffffe7';
            }
            __archive_read_consume(a,0xc);
            *(undefined1 *)((long)pvVar1 + 0x1f84) = 1;
            if ((*(byte *)(*(long *)((long)pvVar1 + 0x70) + 0x7e) & 8) == 0) {
              *(long *)((long)pvVar1 + 0x78) = *(long *)((long)pvVar1 + 0x78) + -0xc;
            }
            *(long *)((long)pvVar1 + 0x80) = *(long *)((long)pvVar1 + 0x80) + 0xc;
            *(undefined8 *)((long)pvVar1 + 0x1f68) = 0;
            wVar4 = zip_alloc_decryption_buffer(a);
            return wVar4;
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
    }
    wVar4 = L'\xffffffe2';
  }
  return wVar4;
}

Assistant:

static int
init_traditional_PKWARE_decryption(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const void *p;
	int retry;
	int r;

	if (zip->tctx_valid)
		return (ARCHIVE_OK);

	/*
	   Read the 12 bytes encryption header stored at
	   the start of the data area.
	 */
#define ENC_HEADER_SIZE	12
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < ENC_HEADER_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated Zip encrypted body: only %jd bytes available",
		    (intmax_t)zip->entry_bytes_remaining);
		return (ARCHIVE_FATAL);
	}

	p = __archive_read_ahead(a, ENC_HEADER_SIZE, NULL);
	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file data");
		return (ARCHIVE_FATAL);
	}

	for (retry = 0;; retry++) {
		const char *passphrase;
		uint8_t crcchk;

		passphrase = __archive_read_next_passphrase(a);
		if (passphrase == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    (retry > 0)?
				"Incorrect passphrase":
				"Passphrase required for this entry");
			return (ARCHIVE_FAILED);
		}

		/*
		 * Initialize ctx for Traditional PKWARE Decryption.
		 */
		r = trad_enc_init(&zip->tctx, passphrase, strlen(passphrase),
			p, ENC_HEADER_SIZE, &crcchk);
		if (r == 0 && crcchk == zip->entry->decdat)
			break;/* The passphrase is OK. */
		if (retry > 10000) {
			/* Avoid infinity loop. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Too many incorrect passphrases");
			return (ARCHIVE_FAILED);
		}
	}

	__archive_read_consume(a, ENC_HEADER_SIZE);
	zip->tctx_valid = 1;
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
	    zip->entry_bytes_remaining -= ENC_HEADER_SIZE;
	}
	/*zip->entry_uncompressed_bytes_read += ENC_HEADER_SIZE;*/
	zip->entry_compressed_bytes_read += ENC_HEADER_SIZE;
	zip->decrypted_bytes_remaining = 0;

	return (zip_alloc_decryption_buffer(a));
#undef ENC_HEADER_SIZE
}